

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<QString,QCss::StyleRule>::emplace<QCss::StyleRule_const&>
          (iterator *__return_storage_ptr__,void *this,QString *key,StyleRule *args)

{
  Data *pDVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  StyleRule local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *this;
  if (pDVar1 == (Data *)0x0) {
    local_68.selectors.d.d = (Data *)0x0;
    local_68.selectors.d.ptr = *(Selector **)((long)this + 8);
LAB_0054a0c1:
    QMultiHash<QString,_QCss::StyleRule>::detach((QMultiHash<QString,_QCss::StyleRule> *)this);
    emplace_helper<QCss::StyleRule_const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<QString,_QCss::StyleRule>::~QMultiHash
              ((QMultiHash<QString,_QCss::StyleRule> *)&local_68);
  }
  else {
    if (1 < (uint)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) {
      local_68.selectors.d.ptr = *(Selector **)((long)this + 8);
      local_68.selectors.d.d = pDVar1;
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_0054a0c1;
    }
    uVar2._0_4_ = pDVar1[1].super_QArrayData.ref_;
    uVar2._4_4_ = pDVar1[1].super_QArrayData.flags;
    if ((ulong)(pDVar1->super_QArrayData).alloc < uVar2 >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        emplace_helper<QCss::StyleRule_const&>(__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_0054a12c;
    }
    QCss::StyleRule::StyleRule(&local_68,args);
    QMultiHash<QString,_QCss::StyleRule>::emplace_helper<QCss::StyleRule>
              (__return_storage_ptr__,(QMultiHash<QString,_QCss::StyleRule> *)this,key,&local_68);
    QCss::StyleRule::~StyleRule(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0054a12c:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }